

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

UCharsTrieBuilder * __thiscall
icu_63::UCharsTrieBuilder::add
          (UCharsTrieBuilder *this,UnicodeString *s,int32_t value,UErrorCode *errorCode)

{
  int iVar1;
  UErrorCode UVar2;
  UCharsTrieElement *__dest;
  UnicodeString *__src;
  UMemory *this_00;
  int iVar3;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar2 = U_NO_WRITE_PERMISSION;
    if (this->ucharsLength < 1) {
      iVar1 = this->elementsCapacity;
      if (this->elementsLength == iVar1) {
        iVar3 = 0x400;
        if (iVar1 != 0) {
          iVar3 = iVar1 * 4;
        }
        this_00 = (UMemory *)0xffffffffffffffff;
        if (-1 < iVar3) {
          this_00 = (UMemory *)((long)iVar3 * 8);
        }
        __src = s;
        __dest = (UCharsTrieElement *)UMemory::operator_new__(this_00,(size_t)s);
        if (__dest == (UCharsTrieElement *)0x0) {
          *errorCode = U_MEMORY_ALLOCATION_ERROR;
        }
        else {
          if (0 < (long)this->elementsLength) {
            __src = (UnicodeString *)this->elements;
            memcpy(__dest,__src,(long)this->elementsLength << 3);
          }
          if (this->elements != (UCharsTrieElement *)0x0) {
            UMemory::operator_delete__((UMemory *)this->elements,__src);
          }
          this->elements = __dest;
          this->elementsCapacity = iVar3;
        }
        if (__dest == (UCharsTrieElement *)0x0) {
          return this;
        }
      }
      iVar1 = this->elementsLength;
      this->elementsLength = iVar1 + 1;
      UCharsTrieElement::setTo(this->elements + iVar1,s,value,&this->strings,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        return this;
      }
      UVar2 = U_MEMORY_ALLOCATION_ERROR;
      if ((undefined1  [56])((undefined1  [56])(this->strings).fUnion & (undefined1  [56])0x1) ==
          (undefined1  [56])0x0) {
        return this;
      }
    }
    *errorCode = UVar2;
  }
  return this;
}

Assistant:

UCharsTrieBuilder &
UCharsTrieBuilder::add(const UnicodeString &s, int32_t value, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(ucharsLength>0) {
        // Cannot add elements after building.
        errorCode=U_NO_WRITE_PERMISSION;
        return *this;
    }
    if(elementsLength==elementsCapacity) {
        int32_t newCapacity;
        if(elementsCapacity==0) {
            newCapacity=1024;
        } else {
            newCapacity=4*elementsCapacity;
        }
        UCharsTrieElement *newElements=new UCharsTrieElement[newCapacity];
        if(newElements==NULL) {
            errorCode=U_MEMORY_ALLOCATION_ERROR;
            return *this;
        }
        if(elementsLength>0) {
            uprv_memcpy(newElements, elements, (size_t)elementsLength*sizeof(UCharsTrieElement));
        }
        delete[] elements;
        elements=newElements;
        elementsCapacity=newCapacity;
    }
    elements[elementsLength++].setTo(s, value, strings, errorCode);
    if(U_SUCCESS(errorCode) && strings.isBogus()) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
    }
    return *this;
}